

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O0

void write_tga_24bit(uint8_t *pixels,uint32_t width,uint32_t height,FILE *fout)

{
  uint local_3c;
  uint32_t i;
  uint32_t image_size;
  undefined8 uStack_2c;
  tga_image_header image_header;
  tga_file_header file_header;
  FILE *fout_local;
  uint32_t height_local;
  uint32_t width_local;
  uint8_t *pixels_local;
  
  uStack_2c = 0x20000;
  i._2_2_ = (undefined2)width;
  image_size._0_2_ = (undefined2)height;
  image_size._2_1_ = 0x18;
  image_size._3_1_ = 0;
  fwrite(&stack0xffffffffffffffd4,0xc,1,(FILE *)fout);
  fwrite((void *)((long)&i + 2),6,1,(FILE *)fout);
  for (local_3c = 0; local_3c < width * height * 3; local_3c = local_3c + 3) {
    fwrite(pixels + (local_3c + 2),1,1,(FILE *)fout);
    fwrite(pixels + (local_3c + 1),1,1,(FILE *)fout);
    fwrite(pixels + local_3c,1,1,(FILE *)fout);
  }
  return;
}

Assistant:

void write_tga_24bit(const uint8_t* pixels, uint32_t width, uint32_t height, FILE* fout) {
    #pragma pack(push, 1)
    #pragma pack(1)
    struct tga_file_header {
        uint8_t  id_length;
        uint8_t  color_map_type;
        uint8_t  image_type;
        uint16_t first_entry_index;
        uint16_t color_map_length;
        uint8_t  color_map_entry_size;
        uint16_t origin_x;
        uint16_t origin_y;
    };
    struct tga_image_header {
        uint16_t image_width;
        uint16_t image_height;
        uint8_t  pixel_depth;
        uint8_t  pixel_descriptor;
    };
    #pragma pack(pop)
    tga_file_header  file_header = {0, 0, 2, 0, 0, 0, 0, 0 };
    tga_image_header image_header = { (uint16_t)width, (uint16_t)height, 24, 0 };
    fwrite(&file_header, sizeof(file_header), 1, fout);
    fwrite(&image_header, sizeof(image_header), 1, fout);
    // input is R,G,B, but we write in B,G,R order. This is a super slow implementation
    // that writes a byte at a time to the file, but whatever...
    uint32_t image_size = width * height * 3;
    for (uint32_t i = 0; i < image_size; i += 3) {
        fwrite(&pixels[i+2], 1, 1, fout);
        fwrite(&pixels[i+1], 1, 1, fout);
        fwrite(&pixels[i+0], 1, 1, fout);
    }
}